

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_async_legacy_policy::get
          (_async_legacy_policy *this,service *srv)

{
  service *p;
  service *in_RDX;
  
  if (*(int *)&((((srv[2].impl_.ptr_)->acceptors_).
                 super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
               super___shared_ptr<cppcms::impl::cgi::acceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == -1) {
    (this->super__policy)._vptr__policy = (_func_int **)0x0;
  }
  else {
    p = srv[3].impl_.ptr_;
    if (p == (service *)0x0) {
      p = (service *)_policy::get_new((_policy *)srv,in_RDX);
      srv[3].impl_.ptr_ = p;
    }
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)this,(application *)p,true);
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &srv)
	{
		if(self_->flags()==-1)
			return 0;
		if(!app_)
			app_ = get_new(srv);
		return app_;
	}